

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bjoinblk(bstrList *bl,void *blk,int len)

{
  int iVar1;
  int local_40;
  int v;
  int c;
  int i;
  uchar *p;
  bstring b;
  int len_local;
  void *blk_local;
  bstrList *bl_local;
  
  if ((bl == (bstrList *)0x0) || (bl->qty < 0)) {
    bl_local = (bstrList *)0x0;
  }
  else if (len < 0) {
    bl_local = (bstrList *)0x0;
  }
  else if ((len < 1) || (blk != (void *)0x0)) {
    if (bl->qty < 1) {
      bl_local = (bstrList *)blk2bstr(anon_var_dwarf_1aaa1 + 0x10,0);
    }
    else {
      local_40 = 1;
      for (v = 0; v < bl->qty; v = v + 1) {
        iVar1 = bl->entry[v]->slen;
        if (iVar1 < 0) {
          return (bstring)0x0;
        }
        if (0x7fffffff - local_40 < iVar1) {
          return (bstring)0x0;
        }
        local_40 = iVar1 + local_40;
      }
      bl_local = (bstrList *)malloc(0x10);
      if (len == 0) {
        _c = (bstring *)malloc((long)local_40);
        bl_local->entry = _c;
        if (_c == (bstring *)0x0) {
          free(bl_local);
          return (bstring)0x0;
        }
        for (v = 0; v < bl->qty; v = v + 1) {
          iVar1 = bl->entry[v]->slen;
          memcpy(_c,bl->entry[v]->data,(long)iVar1);
          _c = (bstring *)((long)_c + (long)iVar1);
        }
      }
      else {
        iVar1 = (bl->qty + -1) * len;
        if (((0x200 < bl->qty) || (0x7f < len)) && (iVar1 / len != bl->qty + -1)) {
          free(bl_local);
          return (bstring)0x0;
        }
        if (0x7fffffff - local_40 < iVar1) {
          free(bl_local);
          return (bstring)0x0;
        }
        local_40 = iVar1 + local_40;
        _c = (bstring *)malloc((long)local_40);
        bl_local->entry = _c;
        if (_c == (bstring *)0x0) {
          free(bl_local);
          return (bstring)0x0;
        }
        iVar1 = (*bl->entry)->slen;
        memcpy(_c,(*bl->entry)->data,(long)iVar1);
        _c = (bstring *)((long)_c + (long)iVar1);
        for (v = 1; v < bl->qty; v = v + 1) {
          memcpy(_c,blk,(long)len);
          _c = (bstring *)((long)_c + (long)len);
          iVar1 = bl->entry[v]->slen;
          if (iVar1 != 0) {
            memcpy(_c,bl->entry[v]->data,(long)iVar1);
            _c = (bstring *)((long)_c + (long)iVar1);
          }
        }
      }
      bl_local->qty = local_40;
      bl_local->mlen = local_40 + -1;
      *(undefined1 *)((long)bl_local->entry + (long)(local_40 + -1)) = 0;
    }
  }
  else {
    bl_local = (bstrList *)0x0;
  }
  return (bstring)bl_local;
}

Assistant:

bstring bjoinblk (const struct bstrList * bl, const void * blk, int len) {
bstring b;
unsigned char * p;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (len < 0) return NULL;
	if (len > 0 && blk == NULL) return NULL;
	if (bl->qty < 1) return bfromStatic ("");

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		if (v > INT_MAX - c) return NULL;	/* Overflow */
		c += v;
	}

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (len == 0) {
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		for (i = 0; i < bl->qty; i++) {
			v = bl->entry[i]->slen;
			bstr__memcpy (p, bl->entry[i]->data, v);
			p += v;
		}
	} else {
		v = (bl->qty - 1) * len;
		if ((bl->qty > 512 || len > 127) &&
			v / len != bl->qty - 1) {
			bstr__free (b);
			return NULL; /* Overflow */
		}
		if (v > INT_MAX - c) {
			bstr__free (b);
			return NULL;    /* Overflow */
		}
		c += v;
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		v = bl->entry[0]->slen;
		bstr__memcpy (p, bl->entry[0]->data, v);
		p += v;
		for (i = 1; i < bl->qty; i++) {
			bstr__memcpy (p, blk, len);
			p += len;
			v = bl->entry[i]->slen;
			if (v) {
				bstr__memcpy (p, bl->entry[i]->data, v);
				p += v;
			}
		}
	}
	b->mlen = c;
	b->slen = c-1;
	b->data[c-1] = (unsigned char) '\0';
	return b;
}